

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O3

void Omega_h::parallel_for<Omega_h::elements_across_sides_count_functor>
               (LO n,elements_across_sides_count_functor *f)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a9;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,"");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_78 = *puVar3;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar3;
    local_88 = (ulong *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x02');
  *(undefined2 *)local_68 = 0x3438;
  uVar4 = 0xf;
  if (local_88 != &local_78) {
    uVar4 = local_78;
  }
  if (uVar4 < (ulong)(local_60 + local_80)) {
    uVar4 = 0xf;
    if (local_68 != local_58) {
      uVar4 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_001dc122;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_001dc122:
  local_a8 = &local_98;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_98 = *plVar1;
    uStack_90 = puVar2[3];
  }
  else {
    local_98 = *plVar1;
    local_a8 = (long *)*puVar2;
  }
  local_a0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  begin_code("parallel_for",(char *)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  for_each<Omega_h::IntIterator,Omega_h::elements_across_sides_count_functor&>
            ((IntIterator)0x0,(IntIterator)n,f);
  ScopedTimer::~ScopedTimer(&local_a9);
  return;
}

Assistant:

void parallel_for(LO n, UnaryFunction&& f) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  ::Omega_h::for_each(first, last, f);
}